

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRewrite.c
# Opt level: O0

void Abc_RwrExpWithCut_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vLeaves,int fUseA)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int fUseA_local;
  Vec_Ptr_t *vLeaves_local;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Vec_PtrFind(vLeaves,pNode);
  if (iVar1 < 0) {
    pAVar2 = Abc_ObjNot(pNode);
    iVar1 = Vec_PtrFind(vLeaves,pAVar2);
    if (iVar1 < 0) {
      iVar1 = Abc_ObjIsNode(pNode);
      if (iVar1 != 0) {
        pAVar2 = Abc_ObjFanin0(pNode);
        Abc_RwrExpWithCut_rec(pAVar2,vLeaves,fUseA);
        pAVar2 = Abc_ObjFanin1(pNode);
        Abc_RwrExpWithCut_rec(pAVar2,vLeaves,fUseA);
        return;
      }
      __assert_fail("Abc_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRewrite.c"
                    ,0x17c,"void Abc_RwrExpWithCut_rec(Abc_Obj_t *, Vec_Ptr_t *, int)");
    }
  }
  if (fUseA == 0) {
    pAVar2 = Abc_ObjRegular(pNode);
    *(uint *)&pAVar2->field_0x14 = *(uint *)&pAVar2->field_0x14 & 0xffffffdf | 0x20;
  }
  else {
    pAVar2 = Abc_ObjRegular(pNode);
    *(uint *)&pAVar2->field_0x14 = *(uint *)&pAVar2->field_0x14 & 0xffffffef | 0x10;
  }
  return;
}

Assistant:

void Abc_RwrExpWithCut_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vLeaves, int fUseA )
{
    if ( Vec_PtrFind(vLeaves, pNode) >= 0 || Vec_PtrFind(vLeaves, Abc_ObjNot(pNode)) >= 0 )
    {
        if ( fUseA )
            Abc_ObjRegular(pNode)->fMarkA = 1;
        else
            Abc_ObjRegular(pNode)->fMarkB = 1;
        return;
    }
    assert( Abc_ObjIsNode(pNode) );
    Abc_RwrExpWithCut_rec( Abc_ObjFanin0(pNode), vLeaves, fUseA );
    Abc_RwrExpWithCut_rec( Abc_ObjFanin1(pNode), vLeaves, fUseA );
}